

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy(void)

{
  bool bVar1;
  Pipeline *pPVar2;
  Type *m;
  Type *m_00;
  Type *m_01;
  Type *m_02;
  Type *m_03;
  ostream *poVar3;
  RepeatedPtrField<CoreML::Specification::Model> *this;
  int iVar4;
  Result res;
  TensorAttributes tensorAttributesD;
  TensorAttributes tensorAttributesB;
  TensorAttributes tensorAttributesC;
  TensorAttributes tensorAttributesA;
  Model spec;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  undefined1 local_d0 [8];
  _Alloc_hider local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  TensorAttributes local_a8;
  TensorAttributes local_98;
  TensorAttributes local_88;
  TensorAttributes local_78;
  Model local_60;
  
  CoreML::Specification::Model::Model(&local_60);
  CoreML::Result::Result((Result *)local_d0);
  local_78.name = "A";
  local_78.dimension = 3;
  local_78._12_4_ = 0;
  local_98.name = "B";
  local_98.dimension = 1;
  local_98._12_4_ = 0;
  local_88.name = "C";
  local_88.dimension = 1;
  local_88._12_4_ = 0;
  local_a8.name = "D";
  local_a8.dimension = 3;
  local_a8._12_4_ = 0;
  pPVar2 = buildEmptyPipelineModelWithStringOutput(&local_60,false,&local_78,"E");
  this = &pPVar2->models_;
  m = google::protobuf::internal::RepeatedPtrFieldBase::
      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_00 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  m_01 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  buildBasicNeuralNetworkModel(m,false,&local_78,&local_98,1,false,false);
  pPVar2 = buildEmptyPipelineModel(m_00,false,&local_98,&local_a8);
  buildBasicNearestNeighborClassifier(m_01,false,&local_a8,"E");
  m_02 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&(pPVar2->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
  m_03 = google::protobuf::internal::RepeatedPtrFieldBase::
         Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                   (&(pPVar2->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
  buildBasicNeuralNetworkModel(m_02,false,&local_98,&local_88,1,false,false);
  buildBasicNeuralNetworkModel(m_03,true,&local_88,&local_a8,1,false,false);
  addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(m_03,"D");
  CoreML::Model::validate((Result *)local_f8,m);
  local_d0 = local_f8;
  std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_p != &local_e0) {
    operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
  }
  bVar1 = CoreML::Result::good((Result *)local_d0);
  if (bVar1) {
    CoreML::Model::validate((Result *)local_f8,m_00);
    local_d0 = local_f8;
    std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    bVar1 = CoreML::Result::good((Result *)local_d0);
    if (bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                 ,0x78);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x487);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    }
    else {
      CoreML::Model::validate((Result *)local_f8,m_01);
      local_d0 = local_f8;
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
      }
      bVar1 = CoreML::Result::good((Result *)local_d0);
      if (bVar1) {
        CoreML::Model::validate((Result *)local_f8,m_02);
        local_d0 = local_f8;
        std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
        }
        bVar1 = CoreML::Result::good((Result *)local_d0);
        if (bVar1) {
          CoreML::Model::validate((Result *)local_f8,m_03);
          local_d0 = local_f8;
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_p != &local_e0) {
            operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
          }
          bVar1 = CoreML::Result::good((Result *)local_d0);
          if (bVar1) {
            CoreML::Model::validate((Result *)local_f8,&local_60);
            local_d0 = local_f8;
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_p != &local_e0) {
              operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
            }
            bVar1 = CoreML::Result::good((Result *)local_d0);
            iVar4 = 0;
            if (bVar1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                         ,0x78);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x494);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"!((res).good())",0xf);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3," was false, expected true.",0x1a);
              iVar4 = 1;
              std::endl<char,std::char_traits<char>>(poVar3);
            }
            goto LAB_0019f3a3;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x78);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x490);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                     ,0x78);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x48d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                   ,0x78);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x48a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x484);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  iVar4 = 1;
  std::ostream::flush();
LAB_0019f3a3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_p != &local_b8) {
    operator_delete(local_c8._M_p,local_b8._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_60);
  return iVar4;
}

Assistant:

int testNonUpdatablePipelineWithOneUpdatableModelInsidePipelineHierarchy() {

    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesA = { "A", 3 };
    TensorAttributes tensorAttributesB = { "B", 1 };
    TensorAttributes tensorAttributesC = { "C", 1 };
    TensorAttributes tensorAttributesD = { "D", 3 };

    auto pipeline1 = buildEmptyPipelineModelWithStringOutput(spec, false, &tensorAttributesA, "E");

    auto m1 = pipeline1->add_models();
    auto m2 = pipeline1->add_models();
    auto m3 = pipeline1->add_models();

    (void)buildBasicNeuralNetworkModel(*m1, false, &tensorAttributesA, &tensorAttributesB);
    auto pipeline2 = buildEmptyPipelineModel(*m2, false, &tensorAttributesB, &tensorAttributesD);
    (void)buildBasicNearestNeighborClassifier(*m3, false, &tensorAttributesD, "E");

    auto m4 = pipeline2->add_models();
    auto m5 = pipeline2->add_models();

    (void)buildBasicNeuralNetworkModel(*m4, false, &tensorAttributesB, &tensorAttributesC);
    (void)buildBasicNeuralNetworkModel(*m5, true, &tensorAttributesC, &tensorAttributesD);
    addCategoricalCrossEntropyLossWithSoftmaxAndSGDOptimizer(*m5, "D");

    res = Model::validate(*m1);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m2);
    ML_ASSERT_BAD(res);

    res = Model::validate(*m3);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m4);
    ML_ASSERT_GOOD(res);

    res = Model::validate(*m5);
    ML_ASSERT_GOOD(res);

    // expect validation to fail due to presence of uptable model in non-updatable pipeline.
    res = Model::validate(spec);
    ML_ASSERT_BAD(res);

    return 0;
}